

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O0

void __thiscall
QTableModel::ensureSorted(QTableModel *this,int column,SortOrder order,int start,int end)

{
  QTableWidgetItem *pQVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  QModelIndexList *indexes;
  qsizetype qVar5;
  const_reference ppVar6;
  const_reference ppQVar7;
  iterator j_00;
  int *piVar8;
  reference ppQVar9;
  char *__filename;
  reference ppVar10;
  int in_ECX;
  QTableModel *in_RDI;
  int in_R8D;
  long in_FS_OFFSET;
  int otherRow;
  int j_2;
  QTableWidgetItem *header;
  int j_1;
  int j;
  int cc;
  int newRow;
  QTableWidgetItem *item;
  int oldRow;
  int i;
  bool changed;
  qsizetype distanceFromBegin;
  _func_bool_pair<QTableWidgetItem_ptr,_int>_ptr_pair<QTableWidgetItem_ptr,_int>_ptr *compare;
  int count;
  QList<QTableWidgetItem_*> rowItems;
  iterator vit;
  QList<QTableWidgetItem_*> colItems;
  QList<QTableWidgetItem_*> newVertical;
  QList<QTableWidgetItem_*> newTable;
  QModelIndexList newPersistentIndexes;
  QModelIndexList oldPersistentIndexes;
  QTableWidgetItem *itm;
  int row;
  QList<std::pair<QTableWidgetItem_*,_int>_> sorting;
  int in_stack_fffffffffffffdb8;
  SortOrder in_stack_fffffffffffffdbc;
  QTableModel *in_stack_fffffffffffffdc0;
  QTableWidgetItem *in_stack_fffffffffffffdc8;
  iterator in_stack_fffffffffffffdd0;
  iterator in_stack_fffffffffffffdd8;
  undefined8 in_stack_fffffffffffffde0;
  int iVar11;
  int local_20c;
  iterator in_stack_fffffffffffffdf8;
  int local_1f4;
  int local_1e8;
  undefined4 in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe2c;
  int iVar12;
  int local_1b8;
  undefined1 local_170 [24];
  undefined1 *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  undefined1 local_140 [48];
  undefined1 local_110 [24];
  QTableWidgetItem **local_f8;
  const_iterator local_f0;
  QTableWidgetItem **local_e8;
  int local_e0;
  int local_dc;
  QTableWidgetItem **local_d8;
  QTableWidgetItem **local_d0;
  QTableWidgetItem **local_c8;
  QTableWidgetItem **local_c0;
  QTableWidgetItem **local_b8;
  iterator local_b0;
  QList<QTableWidgetItem_*> local_a8;
  QList<QTableWidgetItem_*> local_90;
  QList<QTableWidgetItem_*> local_78;
  undefined1 *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  QTableWidgetItem *local_30;
  int local_24;
  QList<std::pair<QTableWidgetItem_*,_int>_> local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_20.d.ptr = (pair<QTableWidgetItem_*,_int> *)&DAT_aaaaaaaaaaaaaaaa;
  local_20.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QList<std::pair<QTableWidgetItem_*,_int>_>::QList
            ((QList<std::pair<QTableWidgetItem_*,_int>_> *)0x8d7030);
  QList<std::pair<QTableWidgetItem_*,_int>_>::reserve
            ((QList<std::pair<QTableWidgetItem_*,_int>_> *)in_RDI,
             CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
  local_24 = in_ECX;
  while ((local_24 <= in_R8D &&
         (local_30 = QTableModel::item(in_RDI,(int)((ulong)in_stack_fffffffffffffde0 >> 0x20),
                                       (int)in_stack_fffffffffffffde0),
         local_30 != (QTableWidgetItem *)0x0))) {
    QList<std::pair<QTableWidgetItem*,int>>::emplace_back<QTableWidgetItem*&,int&>
              ((QList<std::pair<QTableWidgetItem_*,_int>_> *)in_stack_fffffffffffffdc0,
               (QTableWidgetItem **)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
               (int *)0x8d70ad);
    local_24 = local_24 + 1;
  }
  iVar11 = (int)((ulong)in_stack_fffffffffffffde0 >> 0x20);
  QList<std::pair<QTableWidgetItem_*,_int>_>::begin
            ((QList<std::pair<QTableWidgetItem_*,_int>_> *)in_stack_fffffffffffffdc0);
  QList<std::pair<QTableWidgetItem_*,_int>_>::end
            ((QList<std::pair<QTableWidgetItem_*,_int>_> *)in_stack_fffffffffffffdc0);
  std::
  stable_sort<QList<std::pair<QTableWidgetItem*,int>>::iterator,bool(*)(std::pair<QTableWidgetItem*,int>const&,std::pair<QTableWidgetItem*,int>const&)>
            (in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,
             (_func_bool_pair<QTableWidgetItem_ptr,_int>_ptr_pair<QTableWidgetItem_ptr,_int>_ptr *)
             CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  QList<QModelIndex>::QList((QList<QModelIndex> *)0x8d7165);
  local_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  local_50 = &DAT_aaaaaaaaaaaaaaaa;
  QList<QModelIndex>::QList((QList<QModelIndex> *)0x8d719f);
  local_78.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d.ptr = (QTableWidgetItem **)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QList<QTableWidgetItem_*>::QList
            ((QList<QTableWidgetItem_*> *)in_stack_fffffffffffffdc0,
             (QList<QTableWidgetItem_*> *)
             CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
  local_90.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_90.d.ptr = (QTableWidgetItem **)&DAT_aaaaaaaaaaaaaaaa;
  local_90.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QList<QTableWidgetItem_*>::QList
            ((QList<QTableWidgetItem_*> *)in_stack_fffffffffffffdc0,
             (QList<QTableWidgetItem_*> *)
             CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
  local_a8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_a8.d.ptr = (QTableWidgetItem **)&DAT_aaaaaaaaaaaaaaaa;
  local_a8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  columnItems(in_RDI,iVar11);
  local_b0.i = (QTableWidgetItem **)&DAT_aaaaaaaaaaaaaaaa;
  local_b0 = QList<QTableWidgetItem_*>::begin
                       ((QList<QTableWidgetItem_*> *)in_stack_fffffffffffffdc0);
  bVar2 = false;
  local_1b8 = 0;
  while( true ) {
    indexes = (QModelIndexList *)(long)local_1b8;
    qVar5 = QList<std::pair<QTableWidgetItem_*,_int>_>::size(&local_20);
    if (qVar5 <= (long)indexes) break;
    QList<QTableWidgetItem_*>::begin((QList<QTableWidgetItem_*> *)in_stack_fffffffffffffdc0);
    local_b8 = local_b0.i;
    std::distance<QList<QTableWidgetItem*>::iterator>
              ((iterator)in_stack_fffffffffffffdd8.i,(iterator)in_stack_fffffffffffffdd0.i);
    ppVar6 = QList<std::pair<QTableWidgetItem_*,_int>_>::at
                       ((QList<std::pair<QTableWidgetItem_*,_int>_> *)in_stack_fffffffffffffdc0,
                        CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
    iVar11 = ppVar6->second;
    ppQVar7 = QList<QTableWidgetItem_*>::at
                        ((QList<QTableWidgetItem_*> *)in_stack_fffffffffffffdc0,
                         CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
    pQVar1 = *ppQVar7;
    QList<QTableWidgetItem_*>::remove(&local_a8,(char *)(long)iVar11);
    local_d0 = (QTableWidgetItem **)
               QList<QTableWidgetItem_*>::begin
                         ((QList<QTableWidgetItem_*> *)in_stack_fffffffffffffdc0);
    local_c8 = (QTableWidgetItem **)
               QList<QTableWidgetItem_*>::iterator::operator+
                         ((iterator *)in_stack_fffffffffffffdc0,
                          CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
    local_d8 = (QTableWidgetItem **)
               QList<QTableWidgetItem_*>::end
                         ((QList<QTableWidgetItem_*> *)in_stack_fffffffffffffdc0);
    local_c0 = (QTableWidgetItem **)
               sortedInsertionIterator
                         ((iterator *)in_stack_fffffffffffffdc8,
                          (iterator *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbc,
                          in_stack_fffffffffffffdf8.i);
    local_b0 = (iterator)local_c0;
    j_00 = QList<QTableWidgetItem_*>::begin((QList<QTableWidgetItem_*> *)in_stack_fffffffffffffdc0);
    qVar5 = QList<QTableWidgetItem_*>::iterator::operator-(&local_b0,j_00);
    local_dc = (int)qVar5;
    local_e0 = 0;
    piVar8 = qMax<int>(&local_dc,&local_e0);
    iVar12 = *piVar8;
    if (iVar12 < iVar11) {
      in_stack_fffffffffffffdd8.i = (pair<QTableWidgetItem_*,_int> *)pQVar1;
      ppQVar7 = QList<QTableWidgetItem_*>::at
                          ((QList<QTableWidgetItem_*> *)in_stack_fffffffffffffdc0,
                           CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
      uVar3 = (*((QTableWidgetItem *)in_stack_fffffffffffffdd8.i)->_vptr_QTableWidgetItem[5])
                        (in_stack_fffffffffffffdd8.i,*ppQVar7);
      if ((uVar3 & 1) == 0) {
        ppQVar7 = QList<QTableWidgetItem_*>::at
                            ((QList<QTableWidgetItem_*> *)in_stack_fffffffffffffdc0,
                             CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
        uVar3 = (*(*ppQVar7)->_vptr_QTableWidgetItem[5])(*ppQVar7,pQVar1);
        if ((uVar3 & 1) == 0) {
          iVar12 = iVar11;
        }
      }
    }
    local_f8 = local_b0.i;
    QList<QTableWidgetItem_*>::const_iterator::const_iterator(&local_f0,local_b0);
    local_e8 = (QTableWidgetItem **)
               QList<QTableWidgetItem_*>::insert
                         ((QList<QTableWidgetItem_*> *)in_stack_fffffffffffffdc0,
                          (const_iterator)in_stack_fffffffffffffdd8.i,
                          (parameter_type)
                          CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
    local_b0 = (iterator)local_e8;
    if (iVar12 != iVar11) {
      if (!bVar2) {
        memset(local_110,0,0x18);
        QList<QPersistentModelIndex>::QList((QList<QPersistentModelIndex> *)0x8d7553);
        QAbstractItemModel::layoutAboutToBeChanged
                  ((QList_conflict2 *)in_RDI,(LayoutChangeHint)local_110);
        QList<QPersistentModelIndex>::~QList((QList<QPersistentModelIndex> *)0x8d7577);
        QAbstractItemModel::persistentIndexList();
        QList<QModelIndex>::operator=
                  ((QList<QModelIndex> *)in_stack_fffffffffffffdc0,
                   (QList<QModelIndex> *)
                   CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
        QList<QModelIndex>::~QList((QList<QModelIndex> *)0x8d75ab);
        QList<QModelIndex>::operator=
                  ((QList<QModelIndex> *)in_stack_fffffffffffffdc0,
                   (QList<QModelIndex> *)
                   CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
        bVar2 = true;
      }
      QModelIndex::QModelIndex((QModelIndex *)0x8d75d5);
      iVar4 = (**(code **)(*(long *)in_RDI + 0x80))(in_RDI,local_140);
      local_158 = &DAT_aaaaaaaaaaaaaaaa;
      local_150 = &DAT_aaaaaaaaaaaaaaaa;
      local_148 = &DAT_aaaaaaaaaaaaaaaa;
      QList<QTableWidgetItem_*>::QList
                ((QList<QTableWidgetItem_*> *)in_stack_fffffffffffffdc0,
                 CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
      for (local_1e8 = 0; local_1e8 < iVar4; local_1e8 = local_1e8 + 1) {
        tableIndex(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8);
        ppQVar7 = QList<QTableWidgetItem_*>::at
                            ((QList<QTableWidgetItem_*> *)in_stack_fffffffffffffdc0,
                             CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
        in_stack_fffffffffffffdd0.i = (pair<QTableWidgetItem_*,_int> *)*ppQVar7;
        ppQVar9 = QList<QTableWidgetItem_*>::operator[]
                            ((QList<QTableWidgetItem_*> *)in_stack_fffffffffffffdc0,
                             CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
        *ppQVar9 = (QTableWidgetItem *)in_stack_fffffffffffffdd0.i;
      }
      __filename = (char *)tableIndex(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbc,
                                      in_stack_fffffffffffffdb8);
      QList<QTableWidgetItem_*>::remove(&local_78,__filename);
      tableIndex(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8);
      QList<QTableWidgetItem_*>::insert
                ((QList<QTableWidgetItem_*> *)in_stack_fffffffffffffdd8.i,
                 (qsizetype)in_stack_fffffffffffffdd0.i,(qsizetype)in_stack_fffffffffffffdc8,
                 (parameter_type)in_stack_fffffffffffffdc0);
      for (local_1f4 = 0; local_1f4 < iVar4; local_1f4 = local_1f4 + 1) {
        ppQVar7 = QList<QTableWidgetItem_*>::at
                            ((QList<QTableWidgetItem_*> *)in_stack_fffffffffffffdc0,
                             CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
        in_stack_fffffffffffffdc8 = *ppQVar7;
        tableIndex(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8);
        ppQVar9 = QList<QTableWidgetItem_*>::operator[]
                            ((QList<QTableWidgetItem_*> *)in_stack_fffffffffffffdc0,
                             CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
        *ppQVar9 = in_stack_fffffffffffffdc8;
      }
      QList<QTableWidgetItem_*>::at
                ((QList<QTableWidgetItem_*> *)in_stack_fffffffffffffdc0,
                 CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
      QList<QTableWidgetItem_*>::remove(&local_90,(char *)(long)iVar11);
      in_stack_fffffffffffffdf8 =
           QList<QTableWidgetItem_*>::insert
                     ((QList<QTableWidgetItem_*> *)in_stack_fffffffffffffdc8,
                      (qsizetype)in_stack_fffffffffffffdc0,
                      (parameter_type)in_stack_fffffffffffffdd8.i);
      updateRowIndexes(in_RDI,indexes,(int)((ulong)in_stack_fffffffffffffdd8.i >> 0x20),
                       (int)in_stack_fffffffffffffdd8.i);
      local_20c = local_1b8;
      while( true ) {
        local_20c = local_20c + 1;
        in_stack_fffffffffffffdc0 = (QTableModel *)(long)local_20c;
        qVar5 = QList<std::pair<QTableWidgetItem_*,_int>_>::size(&local_20);
        if (qVar5 <= (long)in_stack_fffffffffffffdc0) break;
        ppVar6 = QList<std::pair<QTableWidgetItem_*,_int>_>::at
                           ((QList<std::pair<QTableWidgetItem_*,_int>_> *)in_stack_fffffffffffffdc0,
                            CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
        iVar4 = ppVar6->second;
        if ((iVar11 < iVar4) && (iVar4 <= iVar12)) {
          ppVar10 = QList<std::pair<QTableWidgetItem_*,_int>_>::operator[]
                              ((QList<std::pair<QTableWidgetItem_*,_int>_> *)
                               in_stack_fffffffffffffdc0,
                               CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
          ppVar10->second = ppVar10->second + -1;
        }
        else if ((iVar4 < iVar11) && (iVar12 <= iVar4)) {
          ppVar10 = QList<std::pair<QTableWidgetItem_*,_int>_>::operator[]
                              ((QList<std::pair<QTableWidgetItem_*,_int>_> *)
                               in_stack_fffffffffffffdc0,
                               CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
          ppVar10->second = ppVar10->second + 1;
        }
      }
      QList<QTableWidgetItem_*>::~QList((QList<QTableWidgetItem_*> *)0x8d7893);
    }
    local_1b8 = local_1b8 + 1;
  }
  if (bVar2) {
    QList<QTableWidgetItem_*>::operator=
              ((QList<QTableWidgetItem_*> *)in_stack_fffffffffffffdc0,
               (QList<QTableWidgetItem_*> *)
               CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
    QList<QTableWidgetItem_*>::operator=
              ((QList<QTableWidgetItem_*> *)in_stack_fffffffffffffdc0,
               (QList<QTableWidgetItem_*> *)
               CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
    QAbstractItemModel::changePersistentIndexList
              ((QList_conflict2 *)in_RDI,(QList_conflict2 *)&local_48);
    memset(local_170,0,0x18);
    QList<QPersistentModelIndex>::QList((QList<QPersistentModelIndex> *)0x8d7920);
    QAbstractItemModel::layoutChanged((QList_conflict2 *)in_RDI,(LayoutChangeHint)local_170);
    QList<QPersistentModelIndex>::~QList((QList<QPersistentModelIndex> *)0x8d7944);
  }
  QList<QTableWidgetItem_*>::~QList((QList<QTableWidgetItem_*> *)0x8d7951);
  QList<QTableWidgetItem_*>::~QList((QList<QTableWidgetItem_*> *)0x8d795e);
  QList<QTableWidgetItem_*>::~QList((QList<QTableWidgetItem_*> *)0x8d796b);
  QList<QModelIndex>::~QList((QList<QModelIndex> *)0x8d7978);
  QList<QModelIndex>::~QList((QList<QModelIndex> *)0x8d7985);
  QList<std::pair<QTableWidgetItem_*,_int>_>::~QList
            ((QList<std::pair<QTableWidgetItem_*,_int>_> *)0x8d7992);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTableModel::ensureSorted(int column, Qt::SortOrder order,
                               int start, int end)
{
    int count = end - start + 1;
    QList<std::pair<QTableWidgetItem *, int>> sorting;
    sorting.reserve(count);
    for (int row = start; row <= end; ++row) {
        QTableWidgetItem *itm = item(row, column);
        if (itm == nullptr) {
            // no more sortable items (all 0-items are
            // at the end of the table when it is sorted)
            break;
        }
        sorting.emplace_back(itm, row);
    }

    const auto compare = (order == Qt::AscendingOrder ? &itemLessThan : &itemGreaterThan);
    std::stable_sort(sorting.begin(), sorting.end(), compare);
    QModelIndexList oldPersistentIndexes, newPersistentIndexes;
    QList<QTableWidgetItem *> newTable = tableItems;
    QList<QTableWidgetItem *> newVertical = verticalHeaderItems;
    QList<QTableWidgetItem *> colItems = columnItems(column);
    QList<QTableWidgetItem *>::iterator vit = colItems.begin();
    qsizetype distanceFromBegin = 0;
    bool changed = false;
    for (int i = 0; i < sorting.size(); ++i) {
        distanceFromBegin = std::distance(colItems.begin(), vit);
        int oldRow = sorting.at(i).second;
        QTableWidgetItem *item = colItems.at(oldRow);
        colItems.remove(oldRow);
        vit = sortedInsertionIterator(colItems.begin() + distanceFromBegin, colItems.end(), order,
                                      item);
        int newRow = qMax((int)(vit - colItems.begin()), 0);
        if ((newRow < oldRow) && !(*item < *colItems.at(oldRow - 1)) && !(*colItems.at(oldRow - 1) < *item))
            newRow = oldRow;
        vit = colItems.insert(vit, item);
        if (newRow != oldRow) {
            if (!changed) {
                emit layoutAboutToBeChanged({}, QAbstractItemModel::VerticalSortHint);
                oldPersistentIndexes = persistentIndexList();
                newPersistentIndexes = oldPersistentIndexes;
                changed = true;
            }
            // move the items @ oldRow to newRow
            int cc = columnCount();
            QList<QTableWidgetItem *> rowItems(cc);
            for (int j = 0; j < cc; ++j)
                rowItems[j] = newTable.at(tableIndex(oldRow, j));
            newTable.remove(tableIndex(oldRow, 0), cc);
            newTable.insert(tableIndex(newRow, 0), cc, 0);
            for (int j = 0; j < cc; ++j)
                newTable[tableIndex(newRow, j)] = rowItems.at(j);
            QTableWidgetItem *header = newVertical.at(oldRow);
            newVertical.remove(oldRow);
            newVertical.insert(newRow, header);
            // update persistent indexes
            updateRowIndexes(newPersistentIndexes, oldRow, newRow);
            // the index of the remaining rows may have changed
            for (int j = i + 1; j < sorting.size(); ++j) {
                int otherRow = sorting.at(j).second;
                if (oldRow < otherRow && newRow >= otherRow)
                    --sorting[j].second;
                else if (oldRow > otherRow && newRow <= otherRow)
                    ++sorting[j].second;
            }
        }
    }

    if (changed) {
        tableItems = newTable;
        verticalHeaderItems = newVertical;
        changePersistentIndexList(oldPersistentIndexes,
                                  newPersistentIndexes);
        emit layoutChanged({}, QAbstractItemModel::VerticalSortHint);
    }
}